

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

int8_t __thiscall wasm::Random::get(Random *this)

{
  pointer pcVar1;
  uint uVar2;
  size_t sVar3;
  
  sVar3 = this->pos;
  pcVar1 = (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar3 == (long)(this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pcVar1) {
    this->finishedInput = true;
    uVar2 = this->xorFactor + 1;
    this->xorFactor = uVar2;
    sVar3 = 0;
  }
  else {
    uVar2 = this->xorFactor;
  }
  this->pos = sVar3 + 1;
  return (byte)uVar2 ^ pcVar1[sVar3];
}

Assistant:

int8_t Random::get() {
  if (pos == bytes.size()) {
    // We ran out of input; go back to the start for more.
    finishedInput = true;
    pos = 0;
    xorFactor++;
  }
  return bytes[pos++] ^ xorFactor;
}